

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O1

ssl_hs_wait_t bssl::tls13_server_handshake(SSL_HANDSHAKE *hs)

{
  uint8_t *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  ushort uVar4;
  SSLCredentialType SVar5;
  ssl_credential_st *psVar6;
  SSL3_STATE *pSVar7;
  SSL_HANDSHAKE_HINTS *pSVar8;
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var9;
  SSL_CREDENTIAL *cred;
  SSLPAKEShare *pSVar10;
  size_t sVar11;
  void *__src;
  ssl_session_st *psVar12;
  code *pcVar13;
  Span<const_unsigned_char> context;
  Span<const_unsigned_char> id_prover;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  Span<const_unsigned_char> traffic_secret;
  Span<const_unsigned_char> payload;
  Span<const_unsigned_char> traffic_secret_00;
  Span<const_unsigned_char> traffic_secret_01;
  Span<const_unsigned_char> traffic_secret_02;
  Span<const_unsigned_char> traffic_secret_03;
  Span<const_unsigned_char> traffic_secret_04;
  Span<const_unsigned_char> msg_00;
  Span<const_unsigned_char> msg_01;
  Span<const_unsigned_char> ticket;
  Span<const_unsigned_char> id_verifier;
  Span<const_unsigned_char> w0;
  Span<const_unsigned_char> registration_record;
  SSL_HANDSHAKE *pSVar17;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> _Var18;
  undefined1 __p_00 [8];
  CBB *__p_01;
  InplaceVector<unsigned_char,_64UL> *out;
  undefined2 uVar19;
  EVP_HPKE_CTX *ctx;
  UniquePtr<spake2plus::Verifier> *pUVar20;
  UniquePtr<SSL_SESSION> *pUVar21;
  bool bVar22;
  bool bVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  ssl_verify_result_t sVar26;
  int iVar27;
  ssl_ticket_aead_result_t sVar28;
  ssl_private_key_result_t sVar29;
  uint uVar30;
  int iVar31;
  pointer __p_1;
  size_t sVar32;
  EVP_HPKE_KDF *kdf;
  EVP_HPKE_AEAD *aead;
  uchar *puVar33;
  unsigned_short *puVar34;
  Verifier *pVVar35;
  undefined7 extraout_var;
  SSL_CIPHER *pSVar36;
  ulong uVar37;
  EVP_MD *md;
  undefined4 extraout_var_00;
  byte bVar38;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ssl_hs_wait_t sVar39;
  ssl_hs_wait_t sVar40;
  ptrdiff_t _Num_1;
  undefined1 *puVar42;
  SSL *pSVar43;
  SSL_CLIENT_HELLO *in_R9;
  SSL_CLIENT_HELLO *client_hello_00;
  ptrdiff_t _Num;
  long lVar44;
  pointer __p;
  int line;
  Array<unsigned_char> *pAVar45;
  Span<unsigned_char> out_00;
  Array<unsigned_char> AVar46;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<unsigned_char> out_01;
  Array<unsigned_char> AVar47;
  CBS cipher_suites;
  Span<const_unsigned_char> psk;
  OPENSSL_timeval OVar48;
  Span<const_unsigned_char> client_random;
  Span<const_unsigned_char> client_random_00;
  Span<const_unsigned_char> in_02;
  bool unused;
  uint16_t sigalg;
  SSLMessage msg;
  SSL_CLIENT_HELLO client_hello;
  Array<ssl_credential_st_*> creds;
  uint16_t aead_id;
  CBB cert_request_extensions;
  uint8_t alert;
  uint8_t config_id;
  CBB session_id;
  CBB sigalgs_cbb;
  CBB sigalg_contents;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 in_stack_fffffffffffffcec;
  CBS *out_02;
  CBS *pCVar51;
  undefined1 in_stack_fffffffffffffcf0 [8];
  bool local_2c9;
  SSL_HANDSHAKE *local_2c8;
  SSL3_STATE *local_2c0;
  Array<unsigned_char> local_2b8;
  SSL *local_2a8;
  SSL_CLIENT_HELLO *local_2a0;
  undefined1 local_298 [8];
  SSL3_STATE *local_290;
  anon_union_32_2_4f6aaa2e_for_u aStack_288;
  Array<unsigned_char> *local_268;
  long local_260;
  undefined1 local_258 [48];
  uint8_t *local_228;
  ulong local_220;
  _Head_base<0UL,_char_*,_false> local_208;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_200;
  undefined1 local_1d8 [8];
  uint8_t *puStack_1d0;
  CBB local_1a8;
  undefined1 local_178 [8];
  SSL_SESSION *pSStack_170;
  Array<unsigned_char> local_148;
  InplaceVector<unsigned_char,_32UL> *local_138;
  UniquePtr<SSL_CREDENTIAL> *local_130;
  SSL_SESSION *local_128;
  size_t sStack_120;
  undefined1 local_118 [48];
  Array<unsigned_char> *local_e8;
  InplaceVector<unsigned_char,_64UL> *local_e0;
  SSL_SESSION *local_d8;
  ulong local_d0;
  undefined1 local_c8 [8];
  SSL_SESSION *pSStack_c0;
  undefined1 local_98 [48];
  SSL_SESSION *local_68;
  EVP_HPKE_CTX *local_60;
  UniquePtr<spake2plus::Verifier> *local_58;
  SSL_SESSION *local_50;
  UniquePtr<SSL_SESSION> *local_48;
  SSL_SESSION *local_40;
  SSL_SESSION *local_38;
  ssl_hs_wait_t sVar41;
  
  out_02 = (CBS *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
  local_40 = (SSL_SESSION *)&hs->client_traffic_secret_0;
  local_d8 = (SSL_SESSION *)&hs->client_handshake_secret;
  local_38 = (SSL_SESSION *)&hs->early_traffic_secret;
  local_2a0 = (SSL_CLIENT_HELLO *)&hs->transcript;
  local_e0 = &hs->expected_client_finished;
  local_50 = (SSL_SESSION *)&hs->server_traffic_secret_0;
  local_138 = &hs->session_id;
  local_e8 = &hs->key_share_ciphertext;
  local_68 = (SSL_SESSION *)&hs->server_handshake_secret;
  local_60 = &(hs->ech_hpke_ctx).ctx_;
  local_268 = &hs->ech_client_hello_buf;
  local_48 = &hs->new_session;
  local_130 = &hs->credential;
  local_58 = &hs->pake_verifier;
  local_2c8 = hs;
  do {
    uVar37 = (ulong)(uint)hs->tls13_state;
    sVar39 = ssl_hs_error;
    local_d0 = uVar37;
    switch(uVar37) {
    case 0:
      pSVar43 = hs->ssl;
      bVar22 = SSL_HANDSHAKE::GetClientHello
                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_258);
      sVar39 = ssl_hs_error;
      if (bVar22) {
        pCVar51 = out_02;
        iVar27 = SSL_is_quic(pSVar43);
        if ((iVar27 == 0) || (local_220 == 0)) {
          iVar27 = SSL_is_dtls(pSVar43);
          uVar37 = local_220;
          if (iVar27 == 0) {
            if (0x20 < local_220) goto LAB_0027a04b;
            (hs->session_id).size_ = '\0';
            if (local_220 != 0) {
              memmove(local_138,local_228,local_220);
            }
            (hs->session_id).size_ = (PackedSize<32UL>)uVar37;
          }
          local_1d8 = (undefined1  [8])0x0;
          puStack_1d0 = (uint8_t *)0x0;
          local_2a8 = pSVar43;
          bVar22 = ssl_get_full_credential_list(hs,(Array<ssl_credential_st_*> *)local_1d8);
          sVar39 = ssl_hs_error;
          if (bVar22) {
            if (puStack_1d0 == (uint8_t *)0x0) {
              iVar27 = 0x50;
              ERR_put_error(0x10,0,0xae,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x14e);
            }
            else {
              local_2c0 = (SSL3_STATE *)local_1d8;
              local_260 = (long)puStack_1d0 << 3;
              lVar44 = 0;
              do {
                cred = *(SSL_CREDENTIAL **)(local_2c0->server_random + lVar44 + -0x10);
                ERR_clear_error();
                pSVar17 = local_2c8;
                SVar5 = cred->type;
                if (SVar5 == kSPAKE2PlusV1Server) {
                  pSVar10 = (local_2c8->pake_share)._M_t.
                            super___uniq_ptr_impl<bssl::SSLPAKEShare,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bssl::SSLPAKEShare_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSLPAKEShare_*,_false>._M_head_impl;
                  if ((((((pSVar10 == (SSLPAKEShare *)0x0) || (pSVar10->named_pake != 0x7d96)) ||
                        (sVar11 = (pSVar10->client_identity).size_,
                        sVar11 != (cred->client_identity).size_)) ||
                       ((sVar11 != 0 &&
                        (iVar27 = bcmp((pSVar10->client_identity).data_,
                                       (cred->client_identity).data_,sVar11), iVar27 != 0)))) ||
                      (sVar11 = (pSVar10->server_identity).size_,
                      sVar11 != (cred->server_identity).size_)) ||
                     ((sVar11 != 0 &&
                      (iVar27 = bcmp((pSVar10->server_identity).data_,(cred->server_identity).data_,
                                     sVar11), iVar27 != 0)))) {
                    ERR_put_error(0x10,0,0x146,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                  ,0x12a);
LAB_00278e99:
                    iVar27 = 0;
                  }
                  else {
                    if (cred != (SSL_CREDENTIAL *)0x0) {
                      SSL_CREDENTIAL_up_ref(cred);
                    }
                    local_1a8.child = (CBB *)0x0;
                    std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                               local_130,cred);
                    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_1a8)
                    ;
                    pVVar35 = New<bssl::spake2plus::Verifier>();
                    pUVar20 = local_58;
                    local_1a8.child = (CBB *)0x0;
                    std::__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                                *)local_58,pVVar35);
                    std::unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::
                    ~unique_ptr((unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter> *)
                                &local_1a8);
                    pVVar35 = (pUVar20->_M_t).
                              super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                              .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>.
                              _M_head_impl;
                    if (pVVar35 != (Verifier *)0x0) {
                      context.data_ = (cred->pake_context).data_;
                      context.size_ = (cred->pake_context).size_;
                      id_prover.data_ = (cred->client_identity).data_;
                      id_prover.size_ = (cred->client_identity).size_;
                      pAVar45 = &cred->server_identity;
                      local_118._0_8_ = pAVar45->data_;
                      in_stack_fffffffffffffcf0 = (undefined1  [8])(cred->server_identity).size_;
                      id_verifier.data_ = pAVar45->data_;
                      id_verifier.size_ = pAVar45->size_;
                      pAVar45 = &cred->password_verifier_w0;
                      local_178 = (undefined1  [8])pAVar45->data_;
                      pSStack_170 = (SSL_SESSION *)(cred->password_verifier_w0).size_;
                      w0.data_ = pAVar45->data_;
                      w0.size_ = pAVar45->size_;
                      pAVar45 = &cred->registration_record;
                      local_98._0_8_ = pAVar45->data_;
                      local_98._8_8_ = (cred->registration_record).size_;
                      registration_record.data_ = pAVar45->data_;
                      registration_record.size_ = pAVar45->size_;
                      local_c8 = (undefined1  [8])0x0;
                      pSStack_c0 = (SSL_SESSION *)0x0;
                      uVar49 = (undefined4)local_118._0_8_;
                      uVar50 = (undefined4)((ulong)local_118._0_8_ >> 0x20);
                      local_118._8_8_ = in_stack_fffffffffffffcf0;
                      bVar22 = spake2plus::Verifier::Init
                                         (pVVar35,context,id_prover,id_verifier,w0,
                                          registration_record,(Span<const_unsigned_char>)ZEXT816(0))
                      ;
                      pCVar51 = (CBS *)CONCAT44(uVar50,uVar49);
                      iVar27 = 2;
                      if (bVar22) goto LAB_00278e9b;
                    }
                    iVar27 = 1;
                    ssl_send_alert(local_2a8,2,0x50);
                  }
                }
                else {
                  if (SVar5 == kX509) {
LAB_00278dea:
                    bVar22 = tls1_choose_signature_algorithm(pSVar17,cred,(uint16_t *)&local_2b8);
                    if (bVar22) {
                      bVar22 = ssl_credential_matches_requested_issuers(pSVar17,cred);
                    }
                    else {
                      bVar22 = false;
                    }
                  }
                  else {
                    if (SVar5 == kDelegated) {
                      puVar34 = (local_2c8->peer_sigalgs).data_;
                      puVar34 = std::
                                __find_if<unsigned_short*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_short_const>>
                                          (puVar34,puVar34 + (local_2c8->peer_sigalgs).size_,
                                           &cred->dc_algorithm);
                      if (puVar34 != (pSVar17->peer_sigalgs).data_ + (pSVar17->peer_sigalgs).size_)
                      goto LAB_00278dea;
                      iVar31 = 0x10e;
                      iVar27 = 0xfd;
                    }
                    else {
                      iVar31 = 0x113;
                      iVar27 = 0xe4;
                    }
                    bVar22 = false;
                    ERR_put_error(0x10,0,iVar27,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                  ,iVar31);
                  }
                  iVar27 = 0;
                  if (bVar22 != false) {
                    if (cred != (SSL_CREDENTIAL *)0x0) {
                      SSL_CREDENTIAL_up_ref(cred);
                    }
                    local_1a8.child = (CBB *)0x0;
                    std::__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter> *)
                               local_130,cred);
                    std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<ssl_credential_st,_bssl::internal::Deleter> *)&local_1a8)
                    ;
                    local_2c8->signature_algorithm = (uint16_t)local_2b8.data_;
                    iVar27 = 2;
                  }
                  if (bVar22 == false) goto LAB_00278e99;
                }
LAB_00278e9b:
                _Var18._M_head_impl = local_200._M_head_impl;
                hs = local_2c8;
                if (iVar27 != 0) goto LAB_002793ef;
                lVar44 = lVar44 + 8;
              } while (local_260 != lVar44);
              iVar27 = 2;
LAB_002793ef:
              if (iVar27 != 2) goto LAB_002796a0;
              if ((local_130->_M_t).
                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl ==
                  (ssl_credential_st *)0x0) {
                uVar37 = ERR_peek_error();
                iVar27 = 0x28;
                if ((int)uVar37 == 0) {
                  __assert_fail("ERR_peek_error() != 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x16f,
                                "enum ssl_hs_wait_t bssl::do_select_parameters(SSL_HANDSHAKE *)");
                }
              }
              else {
                local_2c0 = (SSL3_STATE *)local_208._M_head_impl;
                uVar25 = ssl_protocol_version(local_2a8);
                uVar4 = *(ushort *)
                         &((local_2a8->config)._M_t.
                           super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                          field_0x10d;
                if ((uVar4 >> 0xb & 1) == 0) {
                  uVar30 = EVP_has_aes_hardware();
                }
                else {
                  uVar30 = uVar4 >> 0xc & 1;
                }
                cipher_suites.len._0_1_ = uVar30 != 0;
                cipher_suites.data = (uint8_t *)_Var18._M_head_impl;
                cipher_suites.len._1_7_ = 0;
                pSVar36 = ssl_choose_tls13_cipher
                                    ((bssl *)local_2c0,cipher_suites,SUB21(uVar25,0),
                                     (uint16_t)
                                     ((local_2a8->config)._M_t.
                                      super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl
                                     )->compliance_policy,(ssl_compliance_policy_t)in_R9);
                hs->new_cipher = pSVar36;
                if (pSVar36 != (SSL_CIPHER *)0x0) {
                  local_1a8.child = (CBB *)CONCAT71(local_1a8.child._1_7_,0x32);
                  bVar22 = ssl_negotiate_alpn(hs,(uint8_t *)&local_1a8,(SSL_CLIENT_HELLO *)local_258
                                             );
                  if (bVar22) {
                    uVar25 = ssl_protocol_version(local_2a8);
                    bVar22 = SSLTranscript::InitHash
                                       ((SSLTranscript *)local_2a0,uVar25,hs->new_cipher);
                    if (bVar22) {
                      hs->tls13_state = 1;
                      sVar39 = ssl_hs_ok;
                      goto LAB_002796a0;
                    }
                  }
                  else {
                    ssl_send_alert(local_2a8,2,(uint)(byte)local_1a8.child);
                  }
                  sVar39 = ssl_hs_error;
                  goto LAB_002796a0;
                }
                iVar27 = 0x28;
                ERR_put_error(0x10,0,0xb8,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x177);
              }
            }
            ssl_send_alert(local_2a8,2,iVar27);
          }
LAB_002796a0:
          out_02 = pCVar51;
          OPENSSL_free((void *)local_1d8);
        }
        else {
          iVar27 = 0x132;
          iVar31 = 0x13c;
LAB_002776ea:
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,iVar31);
          iVar27 = 0x2f;
          out_02 = pCVar51;
LAB_002776fc:
          sVar39 = ssl_hs_error;
          ssl_send_alert(pSVar43,2,iVar27);
        }
      }
      break;
    case 1:
      pSVar7 = (SSL3_STATE *)hs->ssl;
      bVar22 = SSL_HANDSHAKE::GetClientHello
                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_258);
      sVar39 = ssl_hs_error;
      if (!bVar22) break;
      local_2c9 = true;
      lVar44 = *(long *)pSVar7->client_random;
      pSVar43 = hs->ssl;
      local_2b8.data_ = (uchar *)0x0;
      local_2c0 = pSVar7;
      bVar22 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)local_258,(CBS *)local_1d8,0x29);
      sVar28 = ssl_ticket_aead_ignore_ticket;
      if (bVar22) {
        bVar23 = ssl_client_hello_get_extension((SSL_CLIENT_HELLO *)local_258,(CBS *)local_118,0x2d)
        ;
        if (bVar23) {
          out_02 = (CBS *)local_1d8;
          in_R9 = (SSL_CLIENT_HELLO *)local_258;
          bVar23 = ssl_ext_pre_shared_key_parse_clienthello
                             (hs,(CBS *)local_178,(CBS *)local_98,(uint32_t *)&local_128,&local_2c9,
                              in_R9,out_02);
          sVar28 = ssl_ticket_aead_error;
          if (((bVar23) && (sVar28 = ssl_ticket_aead_ignore_ticket, (hs->field_0x6c8 & 0x10) != 0))
             && ((psVar6 = (hs->credential)._M_t.
                           super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,
                 psVar6 == (ssl_credential_st *)0x0 || (psVar6->type != kSPAKE2PlusV1Server)))) {
            local_1a8.child = (CBB *)0x0;
            ticket.size_ = (size_t)pSStack_170;
            ticket.data_ = (uchar *)local_178;
            local_c8 = (undefined1  [8])0x0;
            pSStack_c0 = (SSL_SESSION *)0x0;
            uVar49 = 0;
            uVar50 = 0;
            in_stack_fffffffffffffcf0 = (undefined1  [8])0x0;
            sVar28 = ssl_process_ticket(hs,(UniquePtr<SSL_SESSION> *)&local_1a8,(bool *)&local_148,
                                        ticket,(Span<const_unsigned_char>)ZEXT816(0));
            if (sVar28 == ssl_ticket_aead_success) {
              bVar23 = ssl_session_is_resumable(hs,(SSL_SESSION *)local_1a8.child);
              sVar28 = ssl_ticket_aead_ignore_ticket;
              if ((bVar23) && ((*(undefined1 *)((long)local_1a8.child + 0x1b8) & 8) != 0)) {
                local_128 = (SSL_SESSION *)
                            CONCAT44(local_128._4_4_,
                                     ((int)local_128 - *(uint32_t *)((long)local_1a8.child + 0x180))
                                     / 1000);
                OVar48 = ssl_ctx_get_current_time
                                   ((pSVar43->ctx)._M_t.
                                    super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
                if (OVar48.tv_sec < *(uint64_t *)((long)local_1a8.child + 0xd0)) {
                  __assert_fail("now.tv_sec >= session->time",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                ,0x1d5,
                                "enum ssl_ticket_aead_result_t bssl::select_session(SSL_HANDSHAKE *, uint8_t *, UniquePtr<SSL_SESSION> *, int32_t *, bool *, const SSLMessage &, const SSL_CLIENT_HELLO *)"
                               );
                }
                uVar37 = OVar48.tv_sec - *(uint64_t *)((long)local_1a8.child + 0xd0);
                if (uVar37 < 0x80000000) {
                  *(int *)(lVar44 + 0xfc) = (int)local_128 - (int)uVar37;
                  bVar23 = tls13_verify_psk_binder
                                     (hs,(SSL_SESSION *)local_1a8.child,(SSLMessage *)local_298,
                                      (CBS *)local_98);
                  __p_01 = local_1a8.child;
                  if (!bVar23) {
                    local_2c9 = true;
                    goto LAB_00278213;
                  }
                  local_1a8.child = (CBB *)0x0;
                  std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                            ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)&local_2b8,
                             (pointer)__p_01);
                  sVar28 = ssl_ticket_aead_success;
                }
              }
            }
            else if (sVar28 == ssl_ticket_aead_error) {
              local_2c9 = true;
LAB_00278213:
              sVar28 = ssl_ticket_aead_error;
            }
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_1a8);
            out_02 = (CBS *)CONCAT44(uVar50,uVar49);
          }
        }
        else {
          local_2c9 = true;
          sVar28 = ssl_ticket_aead_error;
          ERR_put_error(0x10,0,0xa4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x1a1);
        }
      }
      switch(sVar28) {
      case ssl_ticket_aead_success:
        SSL_SESSION_dup((bssl *)local_1d8,(SSL_SESSION *)local_2b8.data_,0);
        pUVar21 = local_48;
        __p_00 = local_1d8;
        local_1d8 = (undefined1  [8])0x0;
        std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)local_48,
                   (pointer)__p_00);
        std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_1d8);
        if ((pUVar21->_M_t).super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl != (ssl_session_st *)0x0) {
          puVar2 = (ushort *)(*(long *)local_2c0->client_random + 0xdc);
          *puVar2 = *puVar2 | 0x20;
          hs->field_0x6ca = hs->field_0x6ca | 0x80;
          ssl_session_renew_timeout
                    ((SSL *)local_2c0,
                     (hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                     *(uint32_t *)(*(long *)&(local_2c0->write_buffer).offset_ + 0x9c));
          break;
        }
        bVar38 = 0x50;
        goto LAB_00279251;
      case ssl_ticket_aead_retry:
        sVar39 = ssl_hs_pending_ticket;
        goto LAB_002791c0;
      case ssl_ticket_aead_ignore_ticket:
        if ((SSL_SESSION *)local_2b8.data_ != (SSL_SESSION *)0x0) {
          __assert_fail("!session",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x20a,"enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)");
        }
        bVar23 = ssl_get_new_session(hs);
        bVar38 = 0x50;
        if (!bVar23) goto LAB_00279251;
        break;
      case ssl_ticket_aead_error:
        goto switchD_002790b1_caseD_3;
      }
      bVar23 = ssl_negotiate_alps(hs,&local_2c9,(SSL_CLIENT_HELLO *)local_258);
      if (bVar23) {
        ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->cipher = hs->new_cipher;
        if ((hs->pake_verifier)._M_t.
            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
            (Verifier *)0x0) {
          bVar23 = tls1_get_shared_group
                             (hs,&((hs->new_session)._M_t.
                                   super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                                  group_id);
          if (bVar23) {
            bVar23 = ssl_ext_key_share_parse_clienthello
                               (hs,(bool *)local_1d8,(Span<const_unsigned_char> *)0x0,&local_2c9,
                                (SSL_CLIENT_HELLO *)local_258);
            if (bVar23) {
              uVar30 = (uint)CONCAT71(extraout_var,local_1d8[0]) ^ 1;
              goto LAB_00279221;
            }
            ssl_send_alert((SSL *)local_2c0,2,(uint)local_2c9);
            sVar39 = ssl_hs_error;
            goto LAB_00279bab;
          }
          iVar27 = 0x28;
          ERR_put_error(0x10,0,0x10a,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x23b);
LAB_00279b90:
          ssl_send_alert((SSL *)local_2c0,2,iVar27);
          goto LAB_00279ba2;
        }
        uVar30 = 0;
LAB_00279221:
        puVar33 = local_2b8.data_;
        local_260 = CONCAT44(local_260._4_4_,uVar30);
        if (((local_2c0->pending_write).size_ & 0x400000000) == 0) {
          *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 1;
        }
        else if (bVar22) {
          if ((SSL_SESSION *)local_2b8.data_ == (SSL_SESSION *)0x0) {
            *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 6;
          }
          else if (*(uint32_t *)((long)local_2b8.data_ + 0x184) == 0) {
            *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 7;
          }
          else if ((*(uint *)&hs->field_0x6c8 >> 0xb & 1) == 0) {
            *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 4;
          }
          else {
            lVar44 = *(long *)local_2c0->client_random;
            if ((*(uint *)&hs->field_0x6c8 >> 0x18 & 1) == 0) {
              sVar11 = *(size_t *)(lVar44 + 0x220);
              if ((sVar11 == ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x188))->size_) &&
                 ((sVar11 == 0 ||
                  (iVar27 = bcmp(*(void **)(lVar44 + 0x218),
                                 ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x188))->data_,
                                 sVar11), iVar27 == 0)))) {
                psVar12 = (hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                if (((((*(undefined1 *)((long)puVar33 + 0x1b8) ^ psVar12->field_0x1b8) & 0x40) == 0)
                    && (sVar11 = (psVar12->local_application_settings).size_,
                       sVar11 == ((Array<unsigned_char> *)((long)puVar33 + 0x198))->size_)) &&
                   ((sVar11 == 0 ||
                    (iVar27 = bcmp((psVar12->local_application_settings).data_,
                                   ((Array<unsigned_char> *)((long)puVar33 + 0x198))->data_,sVar11),
                    iVar27 == 0)))) {
                  if (*(int *)(lVar44 + 0xfc) - 0x3dU < 0xffffff87) {
                    *(undefined4 *)(lVar44 + 0x100) = 0xc;
                  }
                  else {
                    bVar22 = quic_ticket_compatible((SSL_SESSION *)puVar33,hs->config);
                    hs = local_2c8;
                    if (bVar22) {
                      if ((char)local_260 == '\0') {
                        if (local_2c8->new_cipher != *(SSL_CIPHER **)((long)local_2b8.data_ + 0xd8))
                        {
                          __assert_fail("hs->new_cipher == session->cipher",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                        ,0x269,
                                        "enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)"
                                       );
                        }
                        lVar44 = *(long *)local_2c0->client_random;
                        *(undefined4 *)(lVar44 + 0x100) = 2;
                        pbVar3 = (byte *)(lVar44 + 0xdd);
                        *pbVar3 = *pbVar3 | 2;
                      }
                      else {
                        *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 8;
                      }
                    }
                    else {
                      *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 0xd;
                    }
                  }
                }
                else {
                  *(undefined4 *)(lVar44 + 0x100) = 0xe;
                }
              }
              else {
                *(undefined4 *)(lVar44 + 0x100) = 9;
              }
            }
            else {
              *(undefined4 *)(lVar44 + 0x100) = 10;
            }
          }
        }
        else {
          *(undefined4 *)(*(long *)local_2c0->client_random + 0x100) = 5;
        }
        __src = *(void **)(*(long *)local_2c0->client_random + 0x218);
        sVar32 = *(size_t *)(*(long *)local_2c0->client_random + 0x220);
        pAVar45 = &((hs->new_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->early_alpn;
        bVar22 = Array<unsigned_char>::InitUninitialized(pAVar45,sVar32);
        if (bVar22 && sVar32 != 0) {
          memmove(pAVar45->data_,__src,sVar32);
        }
        iVar27 = 0x50;
        if (!bVar22) goto LAB_00279b90;
        if (((*(byte *)(*(long *)local_2c0->client_random + 0xdd) & 2) != 0) &&
           (psVar12 = (hs->new_session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
           (psVar12->field_0x1b8 & 0x40) != 0)) {
          local_2a8 = (SSL *)((Array<unsigned_char> *)((long)local_2b8.data_ + 0x1a8))->data_;
          sVar32 = ((Array<unsigned_char> *)((long)local_2b8.data_ + 0x1a8))->size_;
          pAVar45 = &psVar12->peer_application_settings;
          bVar22 = Array<unsigned_char>::InitUninitialized(pAVar45,sVar32);
          if (bVar22 && sVar32 != 0) {
            memmove(pAVar45->data_,local_2a8,sVar32);
          }
          if (!bVar22) goto LAB_00279b90;
        }
        if ((((local_2c0->pending_write).size_ & 0x400000000) != 0) &&
           (iVar31 = SSL_is_quic((SSL *)local_2c0), iVar31 != 0)) {
          local_2a8 = (SSL *)(hs->config->quic_early_data_context).data_;
          sVar32 = (hs->config->quic_early_data_context).size_;
          pAVar45 = &((hs->new_session)._M_t.
                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                     quic_early_data_context;
          bVar22 = Array<unsigned_char>::InitUninitialized(pAVar45,sVar32);
          if (bVar22 && sVar32 != 0) {
            memmove(pAVar45->data_,local_2a8,sVar32);
          }
          if (!bVar22) goto LAB_00279b90;
        }
        pcVar13 = *(code **)((local_2c0->write_buffer).buf_ + 0x170);
        if ((pcVar13 != (code *)0x0) && (iVar31 = (*pcVar13)(local_258), iVar31 == 0)) {
          ERR_put_error(0x10,0,0x85,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x28e);
          goto LAB_00279b90;
        }
        pSVar7 = local_2c0;
        uVar25 = ssl_protocol_version((SSL *)local_2c0);
        md = (EVP_MD *)ssl_get_handshake_digest(uVar25,hs->new_cipher);
        iVar27 = EVP_MD_size(md);
        uVar37 = CONCAT44(extraout_var_00,iVar27);
        puVar42 = kZeroes;
        if ((*(byte *)(*(long *)pSVar7->client_random + 0xdc) & 0x20) != 0) {
          psVar12 = (hs->new_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
          uVar37 = (ulong)(psVar12->secret).size_;
          puVar42 = (psVar12->secret).storage_;
        }
        psk.size_ = uVar37;
        psk.data_ = puVar42;
        bVar22 = tls13_init_key_schedule(hs,psk);
        sVar40 = ssl_hs_error;
        sVar41 = ssl_hs_error;
        sVar39 = sVar40;
        if ((bVar22) && (bVar22 = ssl_hash_message(hs,(SSLMessage *)local_298), bVar22)) {
          uVar30 = *(uint *)(*(long *)pSVar7->client_random + 0xdc);
          sVar39 = sVar41;
          if ((uVar30 >> 9 & 1) == 0) {
            if ((hs->field_0x6c9 & 8) != 0) {
              *(ushort *)(*(long *)pSVar7->client_random + 0xdc) = (ushort)uVar30 | 1;
            }
          }
          else {
            bVar22 = tls13_derive_early_secret(hs);
            if (!bVar22) goto LAB_00279bab;
          }
          if ((char)local_260 == '\0') {
            if ((hs->pake_verifier)._M_t.
                super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl ==
                (Verifier *)0x0) {
              bVar22 = resolve_ecdhe_secret(hs,(SSL_CLIENT_HELLO *)local_258);
            }
            else {
              if ((*(byte *)(*(long *)pSVar7->client_random + 0xdc) & 0x20) != 0) {
                __assert_fail("!ssl->s3->session_reused",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x2b0,"enum ssl_hs_wait_t bssl::do_select_session(SSL_HANDSHAKE *)");
              }
              bVar22 = ssl_credential_st::ClaimPAKEAttempt
                                 ((hs->credential)._M_t.
                                  super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>
                                  .super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl);
              if (!bVar22) {
                ERR_put_error(0x10,0,0x145,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x2b4);
                ssl_send_alert(hs->ssl,2,0x50);
                goto LAB_00279bab;
              }
              bVar22 = resolve_pake_secret(hs);
            }
            if (bVar22 != false) {
              (**(code **)(pSVar7->read_sequence + 0x20))(pSVar7);
              OPENSSL_free(local_268->data_);
              local_268->data_ = (uchar *)0x0;
              local_268->size_ = 0;
              sVar39 = ssl_hs_ok;
              sVar28 = 4;
              goto LAB_002791c0;
            }
          }
          else {
            (**(code **)(pSVar7->read_sequence + 0x20))(pSVar7);
            bVar22 = SSLTranscript::UpdateForHelloRetryRequest((SSLTranscript *)local_2a0);
            sVar39 = sVar40;
            if (bVar22) {
              sVar39 = ssl_hs_ok;
              sVar28 = ssl_ticket_aead_ignore_ticket;
LAB_002791c0:
              hs->tls13_state = sVar28;
            }
          }
        }
      }
      else {
switchD_002790b1_caseD_3:
        bVar38 = local_2c9;
LAB_00279251:
        ssl_send_alert((SSL *)local_2c0,2,(uint)bVar38);
LAB_00279ba2:
        sVar39 = ssl_hs_error;
      }
LAB_00279bab:
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_2b8);
      break;
    case 2:
      sVar39 = ssl_hs_hints_ready;
      if ((hs->field_0x6ca & 0x10) == 0) {
        if ((hs->pake_verifier)._M_t.
            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
            (Verifier *)0x0) {
          __assert_fail("hs->pake_verifier == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,0x2cf,
                        "enum ssl_hs_wait_t bssl::do_send_hello_retry_request(SSL_HANDSHAKE *)");
        }
        pSVar43 = hs->ssl;
        CBB_zero((CBB *)local_258);
        bVar22 = (*pSVar43->method->init_message)(pSVar43,(CBB *)local_258,(CBB *)local_298,'\x02');
        sVar39 = ssl_hs_error;
        sVar40 = ssl_hs_error;
        if (bVar22) {
          iVar27 = SSL_is_dtls(pSVar43);
          uVar25 = 0xfefd;
          if (iVar27 == 0) {
            uVar25 = 0x303;
          }
          iVar27 = CBB_add_u16((CBB *)local_298,uVar25);
          if ((((iVar27 != 0) &&
               (iVar27 = CBB_add_bytes((CBB *)local_298,kHelloRetryRequest,0x20), iVar27 != 0)) &&
              (iVar27 = CBB_add_u8_length_prefixed((CBB *)local_298,(CBB *)local_1d8),
              sVar39 = sVar40, iVar27 != 0)) &&
             (iVar27 = CBB_add_bytes((CBB *)local_1d8,(uint8_t *)local_138,
                                     (ulong)(hs->session_id).size_), iVar27 != 0)) {
            uVar25 = SSL_CIPHER_get_protocol_id(hs->new_cipher);
            iVar27 = CBB_add_u16((CBB *)local_298,uVar25);
            if (((((iVar27 != 0) && (iVar27 = CBB_add_u8((CBB *)local_298,'\0'), iVar27 != 0)) &&
                 (((iVar27 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_118),
                   iVar27 != 0 &&
                   ((iVar27 = CBB_add_u16((CBB *)local_118,0x2b), iVar27 != 0 &&
                    (iVar27 = CBB_add_u16((CBB *)local_118,2), iVar27 != 0)))) &&
                  (iVar27 = CBB_add_u16((CBB *)local_118,pSVar43->s3->version), iVar27 != 0)))) &&
                (((iVar27 = CBB_add_u16((CBB *)local_118,0x33), iVar27 != 0 &&
                  (iVar27 = CBB_add_u16((CBB *)local_118,2), iVar27 != 0)) &&
                 (iVar27 = CBB_add_u16((CBB *)local_118,
                                       ((hs->new_session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                       )->group_id), iVar27 != 0)))) &&
               (((hs->field_0x6c8 & 1) == 0 ||
                (((iVar27 = CBB_add_u16((CBB *)local_118,0xfe0d), iVar27 != 0 &&
                  (iVar27 = CBB_add_u16((CBB *)local_118,8), iVar27 != 0)) &&
                 (iVar27 = CBB_add_zeros((CBB *)local_118,8), iVar27 != 0)))))) {
              local_178 = (undefined1  [8])0x0;
              pSStack_170 = (SSL_SESSION *)0x0;
              bVar22 = (*pSVar43->method->finish_message)
                                 (pSVar43,(CBB *)local_258,(Array<unsigned_char> *)local_178);
              hs = local_2c8;
              uVar49 = (undefined4)((ulong)out_02 >> 0x20);
              sVar39 = ssl_hs_error;
              if (bVar22) {
                if ((local_2c8->field_0x6c8 & 1) != 0) {
                  if (pSStack_170 < (SSL_SESSION *)0x8) goto LAB_0027a04b;
                  out_00.data_ = (pSStack_170->secret).storage_ +
                                 (long)&((SSL_SESSION *)((long)local_178 + -0x1d0))->field_0x1be;
                  client_random.data_ = pSVar43->s3->client_random;
                  local_98._0_8_ = local_178;
                  local_98._8_8_ = pSStack_170;
                  uVar50 = 1;
                  msg_00.size_ = (size_t)pSStack_170;
                  msg_00.data_ = (uchar *)local_178;
                  out_00.size_ = 8;
                  client_random.size_ = 0x20;
                  in_R9 = local_2a0;
                  in_stack_fffffffffffffcf0 = local_178;
                  bVar22 = ssl_ech_accept_confirmation
                                     (local_2c8,out_00,client_random,(SSLTranscript *)local_2a0,true
                                      ,msg_00,(size_t)&pSStack_170[-1].quic_early_data_context.size_
                                     );
                  out_02 = (CBS *)CONCAT44(uVar49,uVar50);
                  if (!bVar22) goto LAB_00279d22;
                }
                p_Var9 = pSVar43->method->add_message;
                local_c8 = (undefined1  [8])0x0;
                pSStack_c0 = (SSL_SESSION *)0x0;
                OPENSSL_free((void *)0x0);
                local_c8 = local_178;
                pSStack_c0 = pSStack_170;
                local_178 = (undefined1  [8])0x0;
                pSStack_170 = (SSL_SESSION *)0x0;
                AVar46.size_ = extraout_RDX;
                AVar46.data_ = local_c8;
                bVar22 = (*p_Var9)(pSVar43,AVar46);
                if (bVar22) {
                  bVar22 = (*pSVar43->method->add_change_cipher_spec)(pSVar43);
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_c8);
                  hs = local_2c8;
                  if (bVar22) {
                    puVar42 = &pSVar43->s3->field_0xdc;
                    *(ushort *)puVar42 = *(ushort *)puVar42 | 0x1000;
                    local_2c8->tls13_state = 3;
                    sVar39 = ssl_hs_flush;
                  }
                }
                else {
                  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_c8);
                  hs = local_2c8;
                }
              }
LAB_00279d22:
              Array<unsigned_char>::~Array((Array<unsigned_char> *)local_178);
            }
          }
        }
        CBB_cleanup((CBB *)local_258);
      }
      break;
    case 3:
      pSVar43 = hs->ssl;
      bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_298);
      sVar39 = ssl_hs_read_message;
      if (bVar22) {
        bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_298,1);
        sVar39 = ssl_hs_error;
        if (bVar22) {
          iVar27 = SSL_parse_client_hello
                             (pSVar43,(SSL_CLIENT_HELLO *)local_258,(uint8_t *)local_290,
                              (size_t)aStack_288.base.buf);
          if (iVar27 == 0) {
            uVar30 = 0x32;
            goto LAB_00279275;
          }
          pCVar51 = out_02;
          if (pSVar43->s3->ech_status == ssl_ech_accepted) {
            bVar22 = ssl_client_hello_get_extension
                               ((SSL_CLIENT_HELLO *)local_258,(CBS *)local_1d8,0xfe0d);
            if (!bVar22) {
              ERR_put_error(0x10,0,0xa4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x31b);
              iVar27 = 0x6d;
              goto LAB_002776fc;
            }
            iVar27 = CBS_get_u8((CBS *)local_1d8,(uint8_t *)&local_2b8);
            iVar31 = 0x32;
            line = 0x32a;
            if ((iVar27 != 0) && ((char)local_2b8.data_ == '\0')) {
              iVar27 = CBS_get_u16((CBS *)local_1d8,(uint16_t *)local_c8);
              if ((iVar27 != 0) &&
                 ((((iVar27 = CBS_get_u16((CBS *)local_1d8,(uint16_t *)&local_1a8), iVar27 != 0 &&
                    (iVar27 = CBS_get_u8((CBS *)local_1d8,(uint8_t *)&local_128), iVar27 != 0)) &&
                   (iVar27 = CBS_get_u16_length_prefixed((CBS *)local_1d8,(CBS *)local_118),
                   iVar27 != 0)) &&
                  ((iVar27 = CBS_get_u16_length_prefixed((CBS *)local_1d8,(CBS *)local_178),
                   ctx = local_60, iVar27 != 0 && (puStack_1d0 == (uint8_t *)0x0)))))) {
                uVar19 = local_c8._0_2_;
                kdf = EVP_HPKE_CTX_kdf(local_60);
                uVar25 = EVP_HPKE_KDF_id(kdf);
                iVar31 = 0x2f;
                line = 0x333;
                hs = local_2c8;
                if (uVar19 == uVar25) {
                  uVar25 = (uint16_t)local_1a8.child;
                  aead = EVP_HPKE_CTX_aead(ctx);
                  uVar24 = EVP_HPKE_AEAD_id(aead);
                  hs = local_2c8;
                  if (((uVar25 == uVar24) && ((uint8_t)local_128 == local_2c8->ech_config_id)) &&
                     ((SSL_SESSION *)local_118._8_8_ == (SSL_SESSION *)0x0)) {
                    local_148.data_ = (uchar *)CONCAT71(local_148.data_._1_7_,0x32);
                    local_98._0_8_ = local_178;
                    local_98._8_8_ = pSStack_170;
                    uVar49 = local_178._0_4_;
                    uVar50 = local_178._4_4_;
                    payload.size_ = (size_t)pSStack_170;
                    payload.data_ = (uchar *)local_178;
                    in_stack_fffffffffffffcf0 = (undefined1  [8])pSStack_170;
                    bVar22 = ssl_client_hello_decrypt
                                       (local_2c8,(uint8_t *)&local_148,&local_2c9,local_268,
                                        (SSL_CLIENT_HELLO *)local_258,payload);
                    if (bVar22) {
                      bVar22 = SSL_HANDSHAKE::GetClientHello
                                         (hs,(SSLMessage *)local_298,(SSL_CLIENT_HELLO *)local_258);
                      pCVar51 = (CBS *)CONCAT44(uVar50,uVar49);
                      if (bVar22) goto LAB_00277fed;
                      ERR_put_error(0x10,0,0x44,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                    ,0x346);
                    }
                    else {
                      ERR_put_error(0x10,0,0x8a,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                                    ,0x33f);
                      ssl_send_alert(pSVar43,2,(uint)(byte)local_148.data_);
                    }
                    out_02 = (CBS *)CONCAT44(uVar50,uVar49);
                    goto LAB_0027927a;
                  }
                }
              }
            }
            sVar39 = ssl_hs_error;
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,line);
            ssl_send_alert(pSVar43,2,iVar31);
          }
          else {
LAB_00277fed:
            out_02 = pCVar51;
            if ((pSVar43->s3->field_0xdc & 0x20) != 0) {
              client_hello_00 = (SSL_CLIENT_HELLO *)local_258;
              out_02 = (CBS *)local_1d8;
              bVar22 = ssl_client_hello_get_extension(client_hello_00,out_02,0x29);
              if (!bVar22) {
                iVar27 = 0x12f;
                iVar31 = 0x356;
                goto LAB_002776ea;
              }
              local_1a8.child = (CBB *)CONCAT71(local_1a8.child._1_7_,0x32);
              bVar22 = ssl_ext_pre_shared_key_parse_clienthello
                                 (hs,(CBS *)local_118,(CBS *)local_178,(uint32_t *)local_c8,
                                  (uint8_t *)&local_1a8,client_hello_00,out_02);
              if (bVar22) {
                bVar22 = tls13_verify_psk_binder
                                   (hs,(hs->new_session)._M_t.
                                       super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                    (SSLMessage *)local_298,(CBS *)local_178);
                uVar30 = 0x33;
                in_R9 = client_hello_00;
                if (bVar22) goto LAB_00277ffe;
              }
              else {
                uVar30 = (uint)(byte)local_1a8.child;
                in_R9 = client_hello_00;
              }
LAB_00279275:
              ssl_send_alert(pSVar43,2,uVar30);
              goto LAB_0027927a;
            }
LAB_00277ffe:
            if ((hs->pake_verifier)._M_t.
                super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl !=
                (Verifier *)0x0) {
              __assert_fail("hs->pake_verifier == nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x370,
                            "enum ssl_hs_wait_t bssl::do_read_second_client_hello(SSL_HANDSHAKE *)")
              ;
            }
            bVar22 = resolve_ecdhe_secret(hs,(SSL_CLIENT_HELLO *)local_258);
            sVar39 = ssl_hs_error;
            if ((bVar22) && (bVar22 = ssl_hash_message(hs,(SSLMessage *)local_298), bVar22)) {
              bVar22 = (*pSVar43->method->has_unprocessed_handshake_data)(pSVar43);
              if (bVar22) {
                ssl_send_alert(pSVar43,2,10);
                iVar27 = 0xff;
                iVar31 = 0x37c;
                goto LAB_0027929c;
              }
              (*pSVar43->method->next_message)(pSVar43);
              OPENSSL_free((hs->ech_client_hello_buf).data_);
              local_268->data_ = (uchar *)0x0;
              local_268->size_ = 0;
              hs->tls13_state = 4;
              goto LAB_00279063;
            }
          }
        }
      }
      break;
    case 4:
      pSVar43 = hs->ssl;
      pSVar7 = pSVar43->s3;
      puVar1 = pSVar7->server_random;
      pSVar8 = (hs->hints)._M_t.
               super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
      local_2c0 = pSVar7;
      if (pSVar8 == (SSL_HANDSHAKE_HINTS *)0x0) {
        RAND_bytes(puVar1,0x20);
      }
      else if (((hs->field_0x6ca & 0x10) == 0) && ((pSVar8->server_random_tls13).size_ == 0x20)) {
        puVar33 = (pSVar8->server_random_tls13).data_;
        uVar14 = *(undefined8 *)puVar33;
        uVar15 = *(undefined8 *)(puVar33 + 8);
        uVar16 = *(undefined8 *)(puVar33 + 0x18);
        *(undefined8 *)(pSVar7->server_random + 0x10) = *(undefined8 *)(puVar33 + 0x10);
        *(undefined8 *)(pSVar7->server_random + 0x18) = uVar16;
        *(undefined8 *)puVar1 = uVar14;
        *(undefined8 *)(pSVar7->server_random + 8) = uVar15;
      }
      else {
        RAND_bytes(puVar1,0x20);
        if ((hs->field_0x6ca & 0x10) != 0) {
          bVar22 = Array<unsigned_char>::InitUninitialized(&pSVar8->server_random_tls13,0x20);
          sVar39 = ssl_hs_error;
          if (!bVar22) break;
          puVar33 = (pSVar8->server_random_tls13).data_;
          uVar14 = *(undefined8 *)puVar1;
          uVar15 = *(undefined8 *)(pSVar7->server_random + 8);
          uVar16 = *(undefined8 *)(pSVar7->server_random + 0x18);
          *(undefined8 *)(puVar33 + 0x10) = *(undefined8 *)(pSVar7->server_random + 0x10);
          *(undefined8 *)(puVar33 + 0x18) = uVar16;
          *(undefined8 *)puVar33 = uVar14;
          *(undefined8 *)(puVar33 + 8) = uVar15;
        }
      }
      local_2b8.data_ = (uchar *)0x0;
      local_2b8.size_ = 0;
      CBB_zero((CBB *)local_258);
      bVar22 = (*pSVar43->method->init_message)(pSVar43,(CBB *)local_258,(CBB *)local_298,'\x02');
      sVar39 = ssl_hs_error;
      if (bVar22) {
        iVar27 = SSL_is_dtls(pSVar43);
        uVar25 = 0xfefd;
        if (iVar27 == 0) {
          uVar25 = 0x303;
        }
        iVar27 = CBB_add_u16((CBB *)local_298,uVar25);
        if (((iVar27 != 0) &&
            (iVar27 = CBB_add_bytes((CBB *)local_298,pSVar43->s3->server_random,0x20), iVar27 != 0))
           && ((iVar27 = CBB_add_u8_length_prefixed((CBB *)local_298,(CBB *)local_118), iVar27 != 0
               && (iVar27 = CBB_add_bytes((CBB *)local_118,(uint8_t *)local_138,
                                          (ulong)(local_2c8->session_id).size_), iVar27 != 0)))) {
          uVar25 = SSL_CIPHER_get_protocol_id(local_2c8->new_cipher);
          iVar27 = CBB_add_u16((CBB *)local_298,uVar25);
          if ((((((iVar27 != 0) && (iVar27 = CBB_add_u8((CBB *)local_298,'\0'), iVar27 != 0)) &&
                (iVar27 = CBB_add_u16_length_prefixed((CBB *)local_298,(CBB *)local_1d8),
                iVar27 != 0)) &&
               ((bVar22 = ssl_ext_pre_shared_key_add_serverhello(local_2c8,(CBB *)local_1d8), bVar22
                && (bVar22 = ssl_ext_pake_add_serverhello(local_2c8,(CBB *)local_1d8), bVar22)))) &&
              (bVar22 = ssl_ext_key_share_add_serverhello(local_2c8,(CBB *)local_1d8), bVar22)) &&
             (iVar27 = ssl_ext_supported_versions_add_serverhello(local_2c8,(CBB *)local_1d8),
             iVar27 != 0)) {
            bVar22 = (*pSVar43->method->finish_message)(pSVar43,(CBB *)local_258,&local_2b8);
            pSVar17 = local_2c8;
            uVar49 = (undefined4)((ulong)out_02 >> 0x20);
            if (bVar22) {
              if ((pSVar43->s3->ech_status == ssl_ech_accepted) &&
                 ((local_2c8->field_0x6c8 & 1) == 0)) {
                __assert_fail("ssl->s3->ech_status != ssl_ech_accepted || hs->ech_is_inner",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x3ae,
                              "enum ssl_hs_wait_t bssl::do_send_server_hello(SSL_HANDSHAKE *)");
              }
              pCVar51 = out_02;
              if ((local_2c8->field_0x6c8 & 1) == 0) {
LAB_00278a4a:
                p_Var9 = pSVar43->method->add_message;
                local_148.data_ = (uchar *)0x0;
                local_148.size_ = 0;
                OPENSSL_free((void *)0x0);
                local_148.data_ = local_2b8.data_;
                local_148.size_ = local_2b8.size_;
                local_2b8.data_ = (uchar *)0x0;
                local_2b8.size_ = 0;
                AVar47.size_ = extraout_RDX_00;
                AVar47.data_ = (uchar *)&local_148;
                bVar22 = (*p_Var9)(pSVar43,AVar47);
                out_02 = pCVar51;
                Array<unsigned_char>::~Array(&local_148);
                if (bVar22) {
                  OPENSSL_free(local_e8->data_);
                  local_e8->data_ = (uchar *)0x0;
                  local_e8->size_ = 0;
                  if ((((pSVar43->s3->field_0xdd & 0x10) != 0) ||
                      (bVar22 = (*pSVar43->method->add_change_cipher_spec)(pSVar43), bVar22)) &&
                     (bVar22 = tls13_derive_handshake_secrets(local_2c8), bVar22)) {
                    in_R9 = (SSL_CLIENT_HELLO *)(ulong)(local_2c8->server_handshake_secret).size_;
                    traffic_secret_02.size_ = (size_t)in_stack_fffffffffffffcf0;
                    traffic_secret_02.data_ = (uchar *)out_02;
                    bVar22 = tls13_set_traffic_key
                                       ((bssl *)pSVar43,(SSL *)0x2,ssl_encryption_early_data,
                                        (evp_aead_direction_t)
                                        (local_2c8->new_session)._M_t.
                                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl
                                        ,local_68,traffic_secret_02);
                    if (((bVar22) &&
                        (bVar22 = (*pSVar43->method->init_message)
                                            (pSVar43,(CBB *)local_258,(CBB *)local_298,'\b'), bVar22
                        )) && ((bVar22 = ssl_add_serverhello_tlsext(local_2c8,(CBB *)local_298),
                               bVar22 && (bVar22 = ssl_add_message_cbb(pSVar43,(CBB *)local_258),
                                         bVar22)))) {
                      if (((pSVar43->s3->field_0xdc & 0x20) == 0) &&
                         ((local_2c8->pake_verifier)._M_t.
                          super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                          .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl
                          == (Verifier *)0x0)) {
                        *(uint *)&local_2c8->field_0x6c8 =
                             *(uint *)&local_2c8->field_0x6c8 & 0xffffffdf |
                             (*(uint *)&local_2c8->config->verify_mode & 1) << 5;
                      }
                      if (((local_2c8->field_0x6c8 & 0x20) == 0) ||
                         ((((((bVar22 = (*pSVar43->method->init_message)
                                                  (pSVar43,(CBB *)local_258,(CBB *)local_298,'\r'),
                              bVar22 && (iVar27 = CBB_add_u8((CBB *)local_298,'\0'), iVar27 != 0))
                             && (iVar27 = CBB_add_u16_length_prefixed
                                                    ((CBB *)local_298,(CBB *)local_178), iVar27 != 0
                                )) && (((iVar27 = CBB_add_u16((CBB *)local_178,0xd), iVar27 != 0 &&
                                        (iVar27 = CBB_add_u16_length_prefixed
                                                            ((CBB *)local_178,(CBB *)local_98),
                                        iVar27 != 0)) &&
                                       ((iVar27 = CBB_add_u16_length_prefixed
                                                            ((CBB *)local_98,(CBB *)local_c8),
                                        iVar27 != 0 &&
                                        (bVar22 = tls12_add_verify_sigalgs
                                                            (local_2c8,(CBB *)local_c8), bVar22)))))
                            ) && ((bVar22 = ssl_has_client_CAs(local_2c8->config), !bVar22 ||
                                  (((iVar27 = CBB_add_u16((CBB *)local_178,0x2f), iVar27 != 0 &&
                                    (iVar27 = CBB_add_u16_length_prefixed
                                                        ((CBB *)local_178,&local_1a8), iVar27 != 0))
                                   && ((bVar22 = ssl_add_client_CA_list(local_2c8,&local_1a8),
                                       bVar22 && (iVar27 = CBB_flush((CBB *)local_178), iVar27 != 0)
                                       ))))))) &&
                          (bVar22 = ssl_add_message_cbb(pSVar43,(CBB *)local_258), bVar22)))) {
                        if (((pSVar43->s3->field_0xdc & 0x20) == 0) &&
                           ((local_2c8->pake_verifier)._M_t.
                            super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl
                            == (Verifier *)0x0)) {
                          bVar22 = tls13_add_certificate(local_2c8);
                          if (bVar22) {
                            local_2c8->tls13_state = 5;
                            sVar39 = ssl_hs_ok;
                          }
                        }
                        else {
                          local_2c8->tls13_state = 6;
                          sVar39 = ssl_hs_ok;
                        }
                      }
                    }
                  }
                }
              }
              else {
                sVar32 = ssl_ech_confirmation_signal_hello_offset(pSVar43);
                puVar1 = local_2c0->server_random;
                client_random_00.data_ = pSVar43->s3->client_random;
                local_128 = (SSL_SESSION *)local_2b8.data_;
                sStack_120 = local_2b8.size_;
                uVar50 = 0;
                msg_01.size_ = local_2b8.size_;
                msg_01.data_ = local_2b8.data_;
                out_01.size_ = 8;
                out_01.data_ = puVar1 + 0x18;
                client_random_00.size_ = 0x20;
                in_R9 = local_2a0;
                in_stack_fffffffffffffcf0 = (undefined1  [8])local_2b8.data_;
                bVar22 = ssl_ech_accept_confirmation
                                   (pSVar17,out_01,client_random_00,(SSLTranscript *)local_2a0,false
                                    ,msg_01,sVar32);
                pCVar51 = (CBS *)CONCAT44(uVar49,uVar50);
                out_02 = (CBS *)CONCAT44(uVar49,uVar50);
                if (bVar22) {
                  if (local_2b8.size_ < sVar32) {
LAB_0027a04b:
                    abort();
                  }
                  *(undefined8 *)
                   (((InplaceVector<unsigned_char,_64UL> *)((long)local_2b8.data_ + 10))->storage_ +
                   (sVar32 - 10)) = *(undefined8 *)(puVar1 + 0x18);
                  out_02 = pCVar51;
                  if (bVar22) goto LAB_00278a4a;
                }
              }
            }
          }
        }
      }
      CBB_cleanup((CBB *)local_258);
      OPENSSL_free(local_2b8.data_);
      hs = local_2c8;
      break;
    case 5:
      sVar29 = tls13_add_certificate_verify(hs);
      sVar39 = ssl_hs_error;
      if (sVar29 != ssl_private_key_failure) {
        if (sVar29 != ssl_private_key_retry) {
          if (sVar29 != ssl_private_key_success) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x41c,
                          "enum ssl_hs_wait_t bssl::do_send_server_certificate_verify(SSL_HANDSHAKE *)"
                         );
          }
          hs->tls13_state = 6;
          goto LAB_00279063;
        }
        hs->tls13_state = 5;
        sVar39 = ssl_hs_private_key_operation;
      }
      break;
    case 6:
      sVar39 = ssl_hs_hints_ready;
      if ((*(uint *)&hs->field_0x6c8 >> 0x14 & 1) == 0) {
        pSVar43 = hs->ssl;
        *(uint *)&hs->field_0x6c8 = *(uint *)&hs->field_0x6c8 | 0x800000;
        bVar22 = tls13_add_finished(hs);
        sVar39 = ssl_hs_error;
        if (bVar22) {
          puVar33 = (uchar *)SSLTranscript::DigestLen((SSLTranscript *)local_2a0);
          in_02.size_ = uVar37;
          in_02.data_ = puVar33;
          bVar22 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)kZeroes,in_02);
          sVar39 = ssl_hs_error;
          if (bVar22) {
            bVar22 = tls13_derive_application_secrets(hs);
            sVar39 = ssl_hs_error;
            if (bVar22) {
              in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->server_traffic_secret_0).size_;
              traffic_secret_00.size_ = (size_t)in_stack_fffffffffffffcf0;
              traffic_secret_00.data_ = (uchar *)out_02;
              bVar22 = tls13_set_traffic_key
                                 ((bssl *)pSVar43,(SSL *)0x3,ssl_encryption_early_data,
                                  (evp_aead_direction_t)
                                  (hs->new_session)._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,
                                  local_50,traffic_secret_00);
              sVar39 = ssl_hs_error;
              if (bVar22) {
                hs->tls13_state = 7;
                bVar22 = (hs->field_0x6ca & 8) == 0;
                sVar39 = ssl_hs_handback;
                goto LAB_00278c4c;
              }
            }
          }
        }
      }
      break;
    case 7:
      if ((hs->ssl->s3->field_0xdd & 2) == 0) {
LAB_00278096:
        hs->tls13_state = 8;
LAB_0027809d:
        sVar39 = ssl_hs_flush;
      }
      else {
        iVar27 = SSL_is_quic(hs->ssl);
        if ((iVar27 != 0) ||
           (in.size_ = 4, in.data_ = "\x05",
           bVar22 = SSLTranscript::Update((SSLTranscript *)local_2a0,in), bVar22)) {
          sVar32 = SSLTranscript::DigestLen((SSLTranscript *)local_2a0);
          out = local_e0;
          InplaceVector<unsigned_char,_64UL>::Resize(local_e0,sVar32);
          bVar22 = tls13_finished_mac(hs,(uint8_t *)out,(size_t *)local_258,false);
          if (bVar22) {
            if (CONCAT71(local_258._1_7_,local_258[0]) ==
                (ulong)(hs->expected_client_finished).size_) {
              iVar27 = SSL_is_dtls(hs->ssl);
              if (iVar27 != 0) {
                __assert_fail("!SSL_is_dtls(hs->ssl)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                              ,0x456,
                              "enum ssl_hs_wait_t bssl::do_send_half_rtt_ticket(SSL_HANDSHAKE *)");
              }
              local_298[0] = true;
              local_298[1] = '\0';
              local_298._2_2_ = (ushort)(hs->expected_client_finished).size_ << 8;
              in_00.size_ = 4;
              in_00.data_ = local_298;
              bVar22 = SSLTranscript::Update((SSLTranscript *)local_2a0,in_00);
              if (((bVar22) &&
                  (in_01.size_._0_1_ = (hs->expected_client_finished).size_,
                  in_01.data_ = (uchar *)local_e0, in_01.size_._1_7_ = 0,
                  bVar22 = SSLTranscript::Update((SSLTranscript *)local_2a0,in_01), bVar22)) &&
                 (bVar22 = tls13_derive_resumption_secret(hs), bVar22)) {
                bVar22 = add_new_session_tickets(hs,(bool *)local_1d8);
                sVar39 = ssl_hs_error;
                if (!bVar22) break;
                goto LAB_00278096;
              }
            }
            else {
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x44d);
            }
          }
LAB_0027927a:
          sVar39 = ssl_hs_error;
        }
        else {
          iVar27 = 0x44;
          iVar31 = 0x441;
LAB_0027929c:
          sVar39 = ssl_hs_error;
          ERR_put_error(0x10,0,iVar27,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                        ,iVar31);
        }
      }
      break;
    case 8:
      pSVar43 = hs->ssl;
      if ((pSVar43->s3->field_0xdd & 2) != 0) {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->early_traffic_secret).size_;
        sVar39 = ssl_hs_error;
        traffic_secret_01.size_ = (size_t)in_stack_fffffffffffffcf0;
        traffic_secret_01.data_ = (uchar *)out_02;
        bVar22 = tls13_set_traffic_key
                           ((bssl *)pSVar43,(SSL *)0x1,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_38,
                            traffic_secret_01);
        if (!bVar22) break;
        hs->field_0x6c9 = hs->field_0x6c9 | 0x34;
      }
      bVar22 = uses_end_of_early_data(pSVar43);
      if (bVar22) {
        hs->tls13_state = 9;
        bVar22 = (pSVar43->s3->field_0xdd & 2) == 0;
        sVar39 = ssl_hs_read_end_of_early_data;
      }
      else {
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
        sVar39 = ssl_hs_error;
        traffic_secret_03.size_ = (size_t)in_stack_fffffffffffffcf0;
        traffic_secret_03.data_ = (uchar *)out_02;
        bVar22 = tls13_set_traffic_key
                           ((bssl *)pSVar43,(SSL *)0x2,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_d8,
                            traffic_secret_03);
        if (!bVar22) break;
        hs->tls13_state = 9;
        bVar22 = (pSVar43->s3->field_0xdd & 2) == 0;
        sVar39 = ssl_hs_early_return;
      }
LAB_00278c4c:
      if (bVar22) {
        sVar39 = ssl_hs_ok;
      }
      break;
    case 9:
      pSVar43 = hs->ssl;
      bVar22 = uses_end_of_early_data(pSVar43);
      if (bVar22) {
        if ((hs->ssl->s3->field_0xdd & 2) != 0) {
          bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
          sVar39 = ssl_hs_error;
          if (bVar22) {
            bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,5);
            sVar40 = ssl_hs_error;
            if (!bVar22) goto LAB_00279008;
            if ((uint8_t *)local_258._16_8_ != (uint8_t *)0x0) {
              ssl_send_alert(pSVar43,2,0x32);
              ERR_put_error(0x10,0,0x89,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x49d);
              sVar40 = ssl_hs_error;
              goto LAB_00279008;
            }
            (*pSVar43->method->next_message)(pSVar43);
            bVar22 = true;
          }
          else {
            sVar40 = ssl_hs_read_message;
LAB_00279008:
            sVar39 = sVar40;
            bVar22 = false;
          }
          if (!bVar22) break;
        }
        in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_handshake_secret).size_;
        sVar39 = ssl_hs_error;
        traffic_secret_04.size_ = (size_t)in_stack_fffffffffffffcf0;
        traffic_secret_04.data_ = (uchar *)out_02;
        bVar22 = tls13_set_traffic_key
                           ((bssl *)pSVar43,(SSL *)0x2,ssl_encryption_initial,
                            (evp_aead_direction_t)
                            (hs->new_session)._M_t.
                            super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_d8,
                            traffic_secret_04);
        if (!bVar22) break;
      }
      hs->tls13_state = 10;
      goto LAB_00279063;
    case 10:
      if (((((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->field_0x1b8 & 0x40) != 0)
         && (pSVar43 = hs->ssl, (pSVar43->s3->field_0xdd & 2) == 0)) {
        bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
        sVar39 = ssl_hs_error;
        if (bVar22) {
          bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,8);
          sVar40 = ssl_hs_error;
          if (!bVar22) goto LAB_00279050;
          local_1d8 = (undefined1  [8])local_258._8_8_;
          puStack_1d0 = (uint8_t *)local_258._16_8_;
          iVar27 = CBS_get_u16_length_prefixed((CBS *)local_1d8,(CBS *)local_118);
          if ((iVar27 == 0) || (puStack_1d0 != (uint8_t *)0x0)) {
            ERR_put_error(0x10,0,0x89,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                          ,0x4be);
            iVar27 = 0x32;
LAB_002794eb:
            bVar22 = false;
            ssl_send_alert(pSVar43,2,iVar27);
          }
          else {
            local_298[0] = true;
            local_298[1] = 'D';
            if ((*(ushort *)&hs->config->field_0x10d >> 0xd & 1) == 0) {
              local_298[0] = true;
              local_298[1] = 'D';
            }
            local_298._2_2_ = 1;
            local_290 = (SSL3_STATE *)0x0;
            aStack_288.base.buf = (uint8_t *)0x0;
            local_98[0] = 0x32;
            local_178 = (undefined1  [8])local_298;
            bVar22 = ssl_parse_extensions
                               ((bssl *)local_118,(CBS *)local_98,local_178,
                                (initializer_list<bssl::SSLExtension_*>)ZEXT816(1),SUB81(in_R9,0));
            uVar14 = aStack_288.base.buf;
            if (!bVar22) {
              uVar30 = (uint)local_98[0];
LAB_00279764:
              ssl_send_alert(pSVar43,2,uVar30);
              goto LAB_00279050;
            }
            if (local_298[3] == '\0') {
              ERR_put_error(0x10,0,0xa4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                            ,0x4d0);
              iVar27 = 0x6d;
              goto LAB_002794eb;
            }
            pAVar45 = &((hs->new_session)._M_t.
                        super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->
                       peer_application_settings;
            local_2c0 = local_290;
            bVar22 = Array<unsigned_char>::InitUninitialized(pAVar45,(size_t)aStack_288.base.buf);
            if ((uint8_t *)uVar14 != (uint8_t *)0x0 && bVar22) {
              memmove(pAVar45->data_,local_2c0,uVar14);
            }
            if ((!bVar22) || (bVar22 = ssl_hash_message(hs,(SSLMessage *)local_258), !bVar22)) {
              uVar30 = 0x50;
              goto LAB_00279764;
            }
            (*pSVar43->method->next_message)(pSVar43);
            bVar22 = true;
          }
        }
        else {
          sVar40 = ssl_hs_read_message;
LAB_00279050:
          sVar39 = sVar40;
          bVar22 = false;
        }
        if (!bVar22) break;
      }
      hs->tls13_state = 0xb;
LAB_00279063:
      sVar39 = ssl_hs_ok;
      break;
    case 0xb:
      pSVar43 = hs->ssl;
      if ((hs->field_0x6c8 & 0x20) == 0) {
        if ((pSVar43->s3->field_0xdc & 0x20) == 0) {
          ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->verify_result = 0;
        }
LAB_0027855c:
        hs->tls13_state = 0xd;
        goto LAB_00279063;
      }
      bVar38 = hs->config->verify_mode;
      bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
      sVar39 = ssl_hs_read_message;
      hs = local_2c8;
      if (bVar22) {
        bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,0xb);
        pSVar17 = local_2c8;
        sVar39 = ssl_hs_error;
        hs = local_2c8;
        if (((bVar22) &&
            (bVar22 = tls13_process_certificate(local_2c8,(SSLMessage *)local_258,(bVar38 & 2) == 0)
            , hs = local_2c8, bVar22)) &&
           (bVar22 = ssl_hash_message(pSVar17,(SSLMessage *)local_258), hs = local_2c8, bVar22)) {
          (*pSVar43->method->next_message)(pSVar43);
          local_2c8->tls13_state = 0xc;
          sVar39 = ssl_hs_ok;
          hs = local_2c8;
        }
      }
      break;
    case 0xc:
      pSVar43 = hs->ssl;
      sVar32 = OPENSSL_sk_num((OPENSSL_STACK *)
                              (((hs->new_session)._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->certs)
                              ._M_t.
                              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                             );
      if (sVar32 == 0) goto LAB_0027855c;
      bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
      sVar39 = ssl_hs_read_message;
      if (bVar22) {
        sVar26 = ssl_verify_peer_cert(hs);
        sVar39 = ssl_hs_error;
        if (sVar26 != ssl_verify_invalid) {
          if (sVar26 == ssl_verify_retry) {
            sVar39 = ssl_hs_certificate_verify;
            iVar27 = 0xc;
          }
          else {
            bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,0xf);
            if (((!bVar22) ||
                (bVar22 = tls13_process_certificate_verify(hs,(SSLMessage *)local_258), !bVar22)) ||
               (bVar22 = ssl_hash_message(hs,(SSLMessage *)local_258), !bVar22)) break;
            (*pSVar43->method->next_message)(pSVar43);
            sVar39 = ssl_hs_ok;
            iVar27 = 0xd;
          }
          hs->tls13_state = iVar27;
        }
      }
      break;
    case 0xd:
      if ((hs->field_0x6cb & 1) == 0) {
LAB_0027825e:
        hs->tls13_state = 0xe;
        goto LAB_00279063;
      }
      pSVar43 = hs->ssl;
      bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
      sVar39 = ssl_hs_read_message;
      if (bVar22) {
        bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,0xcb);
        sVar39 = ssl_hs_error;
        if (((bVar22) && (bVar22 = tls1_verify_channel_id(hs,(SSLMessage *)local_258), bVar22)) &&
           (bVar22 = ssl_hash_message(hs,(SSLMessage *)local_258), bVar22)) {
          (*pSVar43->method->next_message)(pSVar43);
          goto LAB_0027825e;
        }
      }
      break;
    case 0xe:
      pSVar43 = hs->ssl;
      bVar22 = (*pSVar43->method->get_message)(pSVar43,(SSLMessage *)local_258);
      sVar39 = ssl_hs_read_message;
      if (bVar22) {
        bVar22 = ssl_check_message_type(pSVar43,(SSLMessage *)local_258,0x14);
        sVar39 = ssl_hs_error;
        if ((bVar22) &&
           (bVar22 = tls13_process_finished
                               (hs,(SSLMessage *)local_258,
                                (bool)((byte)((ushort)*(undefined2 *)&pSVar43->s3->field_0xdc >> 9)
                                      & 1)), bVar22)) {
          in_R9 = (SSL_CLIENT_HELLO *)(ulong)(hs->client_traffic_secret_0).size_;
          sVar39 = ssl_hs_error;
          traffic_secret.size_ = (size_t)in_stack_fffffffffffffcf0;
          traffic_secret.data_ = (uchar *)out_02;
          bVar22 = tls13_set_traffic_key
                             ((bssl *)pSVar43,(SSL *)0x3,ssl_encryption_initial,
                              (evp_aead_direction_t)
                              (hs->new_session)._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,local_40,
                              traffic_secret);
          if (bVar22) {
            iVar27 = 0x10;
            if ((pSVar43->s3->field_0xdd & 2) != 0) {
LAB_002777dc:
              hs->tls13_state = iVar27;
              psVar6 = (hs->credential)._M_t.
                       super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
              if ((psVar6 != (ssl_credential_st *)0x0) && (psVar6->type == kSPAKE2PlusV1Server)) {
                ssl_credential_st::RestorePAKEAttempt(psVar6);
              }
              (*pSVar43->method->next_message)(pSVar43);
              iVar27 = SSL_is_dtls(pSVar43);
              if (iVar27 == 0) goto LAB_00279063;
              (*pSVar43->method->schedule_ack)(pSVar43);
              goto LAB_0027809d;
            }
            bVar22 = ssl_hash_message(hs,(SSLMessage *)local_258);
            if (bVar22) {
              bVar22 = tls13_derive_resumption_secret(hs);
              iVar27 = 0xf;
              if (bVar22) goto LAB_002777dc;
            }
          }
        }
      }
      break;
    case 0xf:
      pSVar43 = hs->ssl;
      bVar22 = add_new_session_tickets(hs,(bool *)local_258);
      sVar39 = ssl_hs_error;
      if (bVar22) {
        hs->tls13_state = 0x10;
        sVar39 = ssl_hs_ok;
        if (local_258[0] == true) {
          iVar27 = SSL_is_dtls(pSVar43);
          sVar39 = ssl_hs_flush;
          if (iVar27 == 0) {
            iVar27 = SSL_is_quic(pSVar43);
            sVar39 = (uint)(iVar27 != 0) * 3 + ssl_hs_ok;
          }
        }
      }
      break;
    case 0x10:
      return ssl_hs_ok;
    }
    if (hs->tls13_state != (int)local_d0) {
      ssl_do_info_callback(hs->ssl,0x2001,1);
    }
    if (sVar39 != ssl_hs_ok) {
      return sVar39;
    }
  } while( true );
}

Assistant:

enum ssl_hs_wait_t tls13_server_handshake(SSL_HANDSHAKE *hs) {
  while (hs->tls13_state != state13_done) {
    enum ssl_hs_wait_t ret = ssl_hs_error;
    enum tls13_server_hs_state_t state =
        static_cast<enum tls13_server_hs_state_t>(hs->tls13_state);
    switch (state) {
      case state13_select_parameters:
        ret = do_select_parameters(hs);
        break;
      case state13_select_session:
        ret = do_select_session(hs);
        break;
      case state13_send_hello_retry_request:
        ret = do_send_hello_retry_request(hs);
        break;
      case state13_read_second_client_hello:
        ret = do_read_second_client_hello(hs);
        break;
      case state13_send_server_hello:
        ret = do_send_server_hello(hs);
        break;
      case state13_send_server_certificate_verify:
        ret = do_send_server_certificate_verify(hs);
        break;
      case state13_send_server_finished:
        ret = do_send_server_finished(hs);
        break;
      case state13_send_half_rtt_ticket:
        ret = do_send_half_rtt_ticket(hs);
        break;
      case state13_read_second_client_flight:
        ret = do_read_second_client_flight(hs);
        break;
      case state13_process_end_of_early_data:
        ret = do_process_end_of_early_data(hs);
        break;
      case state13_read_client_encrypted_extensions:
        ret = do_read_client_encrypted_extensions(hs);
        break;
      case state13_read_client_certificate:
        ret = do_read_client_certificate(hs);
        break;
      case state13_read_client_certificate_verify:
        ret = do_read_client_certificate_verify(hs);
        break;
      case state13_read_channel_id:
        ret = do_read_channel_id(hs);
        break;
      case state13_read_client_finished:
        ret = do_read_client_finished(hs);
        break;
      case state13_send_new_session_ticket:
        ret = do_send_new_session_ticket(hs);
        break;
      case state13_done:
        ret = ssl_hs_ok;
        break;
    }

    if (hs->tls13_state != state) {
      ssl_do_info_callback(hs->ssl, SSL_CB_ACCEPT_LOOP, 1);
    }

    if (ret != ssl_hs_ok) {
      return ret;
    }
  }

  return ssl_hs_ok;
}